

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMove3<(moira::Instr)71,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 val;
  bool bVar1;
  
  val = *(u32 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  bVar1 = writeOp<(moira::Mode)3,(moira::Size)4,64ul>(this,opcode >> 9 & 7,val);
  if (bVar1) {
    prefetch<4ul>(this);
    (this->reg).sr.n = SUB41(val >> 0x1f,0);
    (this->reg).sr.z = val == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execMove3(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }

    if (!writeOp <MODE_PI, S, AE_INC_PC> (dst, data)) return;
    prefetch<POLLIPL>();

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}